

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O2

spv_result_t
spvBinaryParse(spv_const_context context,void *user_data,uint32_t *code,size_t num_words,
              spv_parsed_header_fn_t parsed_header,spv_parsed_instruction_fn_t parsed_instruction,
              spv_diagnostic *diagnostic)

{
  mapped_type mVar1;
  __node_ptr p_Var2;
  short sVar3;
  undefined8 inst_offset;
  undefined4 endian;
  bool bVar4;
  spv_result_t sVar5;
  spv_ext_inst_type_t sVar6;
  spv_operand_type_t type;
  Op OVar7;
  spv_operand_type_t sVar8;
  spv_operand_type_t sVar9;
  int32_t iVar10;
  uint32_t uVar11;
  DiagnosticStream *pDVar12;
  mapped_type *pmVar13;
  ulong uVar14;
  iterator iVar15;
  undefined8 uVar16;
  iterator iVar17;
  mapped_type *pmVar18;
  __node_ptr p_Var19;
  pointer __s;
  _Hash_node_base *p_Var20;
  __hash_code __c;
  __node_ptr p_Var21;
  ulong uVar22;
  size_type __n;
  uint16_t uVar23;
  int i;
  uint uVar24;
  int iVar25;
  char *pcVar26;
  spv_operand_type_t *types;
  spv_parsed_header_fn_t p_Var27;
  long lVar28;
  Op OVar29;
  Op operand;
  long lVar30;
  undefined1 auVar31 [16];
  uint16_t inst_word_count;
  Op local_45c;
  spv_parsed_operand_t local_458;
  ulong local_448;
  uint32_t first_word;
  uint32_t word;
  spv_operand_desc entry;
  ulong local_430;
  spv_parsed_instruction_t inst;
  spv_opcode_desc opcode_desc;
  ulong local_3e0;
  undefined1 local_3d8 [24];
  spv_ext_inst_table local_3c0;
  MessageConsumer *local_3b8;
  void *local_3b0;
  spv_parsed_header_fn_t local_3a8;
  spv_parsed_instruction_fn_t local_3a0;
  undefined1 local_398 [160];
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spv_ext_inst_type_t>,_std::allocator<std::pair<const_unsigned_int,_spv_ext_inst_type_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_2f8;
  vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> local_2c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2a8;
  vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_> local_290;
  spv_header_t header;
  spv_const_binary_t binary;
  spv_operand_desc entry_3;
  uint auStack_230 [110];
  spv_ext_inst_type_t local_78;
  spv_context_t hijack_context;
  
  p_Var27 = parsed_header;
  spv_context_t::spv_context_t(&hijack_context,context);
  if (diagnostic != (spv_diagnostic *)0x0) {
    *diagnostic = (spv_diagnostic)0x0;
    spvtools::UseDiagnosticAsMessageConsumer(&hijack_context,diagnostic);
  }
  local_3b8 = &hijack_context.consumer;
  local_3d8._0_4_ = hijack_context.target_env;
  local_3d8._8_8_ = hijack_context.operand_table;
  local_3d8._16_4_ = (int)hijack_context.opcode_table;
  local_3d8._20_4_ = hijack_context.opcode_table._4_4_;
  local_3c0 = hijack_context.ext_inst_table;
  local_3b0 = user_data;
  local_3a8 = parsed_header;
  local_3a0 = parsed_instruction;
  anon_unknown.dwarf_245a2d9::Parser::State::State((State *)local_398);
  anon_unknown.dwarf_245a2d9::Parser::State::State((State *)&entry_3,code,num_words,diagnostic);
  anon_unknown.dwarf_245a2d9::Parser::State::operator=((State *)local_398,(State *)&entry_3);
  anon_unknown.dwarf_245a2d9::Parser::State::~State((State *)&entry_3);
  if ((uint *)local_398._0_8_ == (uint *)0x0) {
    anon_unknown.dwarf_245a2d9::Parser::diagnostic((DiagnosticStream *)&entry_3,(Parser *)local_3d8)
    ;
    pcVar26 = "Missing module.";
LAB_0053b2ac:
    std::operator<<((ostream *)&entry_3,pcVar26);
    sVar6 = local_78;
  }
  else if ((ulong)local_398._8_8_ < 5) {
    anon_unknown.dwarf_245a2d9::Parser::diagnostic((DiagnosticStream *)&entry_3,(Parser *)local_3d8)
    ;
    std::operator<<((ostream *)&entry_3,"Module has incomplete header: only ");
    std::ostream::_M_insert<unsigned_long>((ulong)&entry_3);
    std::operator<<((ostream *)&entry_3," words instead of ");
    std::ostream::_M_insert<unsigned_long>((ulong)&entry_3);
    sVar6 = local_78;
  }
  else {
    binary.code = (uint32_t *)local_398._0_8_;
    binary.wordCount = local_398._8_8_;
    sVar5 = spvBinaryEndianness(&binary,(spv_endianness_t *)(local_398 + 0x28));
    if (sVar5 == SPV_SUCCESS) {
      local_398[0x2c] = spvIsHostEndian(local_398._40_4_);
      local_398[0x2c] = !local_398[0x2c];
      sVar5 = spvBinaryHeaderGet(&binary,local_398._40_4_,&header);
      if (sVar5 == SPV_SUCCESS) {
        if (local_3a8 == (spv_parsed_header_fn_t)0x0) {
LAB_0053b462:
          local_398._24_8_ = 5;
LAB_0053b485:
          if ((ulong)local_398._24_8_ < (ulong)local_398._8_8_) {
            local_398._32_8_ = local_398._32_8_ + 1;
            inst.type_id = 0;
            inst.result_id = 0;
            inst.operands = (spv_parsed_operand_t *)0x0;
            inst.words = (uint32_t *)0x0;
            inst.num_words = 0;
            inst.opcode = 0;
            inst.ext_inst_type = SPV_EXT_INST_TYPE_NONE;
            inst.num_operands = 0;
            inst._34_6_ = 0;
            first_word = anon_unknown.dwarf_245a2d9::Parser::peek((Parser *)local_3d8);
            if (local_2a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_2a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start) {
              local_2a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_2a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start;
            }
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_398 + 0xf0),
                       &first_word);
            if (local_2c0.
                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                _M_impl.super__Vector_impl_data._M_finish !=
                local_2c0.
                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                _M_impl.super__Vector_impl_data._M_start) {
              local_2c0.
              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_2c0.
                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                   _M_impl.super__Vector_impl_data._M_start;
            }
            if ((ulong)local_398._8_8_ <= (ulong)local_398._24_8_) {
              __assert_fail("_.word_index < _.num_words",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/binary.cpp"
                            ,0x138,"spv_result_t (anonymous namespace)::Parser::parseInstruction()")
              ;
            }
            inst_word_count = 0;
            spvOpcodeSplit(first_word,&inst_word_count,&inst.opcode);
            if (inst_word_count == 0) {
              anon_unknown.dwarf_245a2d9::Parser::diagnostic
                        ((DiagnosticStream *)&entry_3,(Parser *)local_3d8);
              std::operator<<((ostream *)&entry_3,"Invalid instruction word count: ");
              std::ostream::operator<<((DiagnosticStream *)&entry_3,inst_word_count);
              sVar6 = local_78;
              spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&entry_3);
            }
            else {
              sVar5 = spvtools::AssemblyGrammar::lookupOpcode
                                ((AssemblyGrammar *)local_3d8,(uint)inst.opcode,&opcode_desc);
              inst_offset = local_398._24_8_;
              if (sVar5 == SPV_SUCCESS) {
                local_3e0 = local_398._24_8_ + 1;
                if (local_290.
                    super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                    _M_impl.super__Vector_impl_data._M_finish !=
                    local_290.
                    super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
                  local_290.
                  super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish =
                       local_290.
                       super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                       _M_impl.super__Vector_impl_data._M_start;
                }
                iVar25 = -1;
                local_398._24_8_ = local_3e0;
                for (uVar24 = 0; uVar24 < opcode_desc->numTypes; uVar24 = uVar24 + 1) {
                  std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::push_back
                            ((vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_> *)
                             (local_398 + 0x108),
                             opcode_desc->operandTypes + (int)((uint)opcode_desc->numTypes + iVar25)
                            );
                  iVar25 = iVar25 + -1;
                }
                do {
                  uVar14 = (ulong)inst_word_count;
                  uVar22 = uVar14 + inst_offset;
                  if (uVar22 <= (ulong)local_398._24_8_) {
                    if (local_290.
                        super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                        _M_impl.super__Vector_impl_data._M_start !=
                        local_290.
                        super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                        _M_impl.super__Vector_impl_data._M_finish) {
                      bVar4 = spvOperandIsOptional
                                        (local_290.
                                         super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                                         ._M_impl.super__Vector_impl_data._M_finish[-1]);
                      if (!bVar4) {
                        anon_unknown.dwarf_245a2d9::Parser::diagnostic
                                  ((DiagnosticStream *)&entry_3,(Parser *)local_3d8);
                        std::operator<<((ostream *)&entry_3,"End of input reached while decoding Op"
                                       );
                        pDVar12 = spvtools::DiagnosticStream::operator<<
                                            ((DiagnosticStream *)&entry_3,&opcode_desc->name);
                        std::operator<<((ostream *)pDVar12," starting at word ");
                        std::ostream::_M_insert<unsigned_long>((ulong)pDVar12);
                        std::operator<<((ostream *)pDVar12,": expected more operands after ");
                        std::ostream::operator<<(pDVar12,inst_word_count);
                        pcVar26 = " words.";
                        goto LAB_0053c332;
                      }
                      uVar14 = (ulong)inst_word_count;
                      uVar22 = uVar14 + inst_offset;
                    }
                    if (uVar22 != local_398._24_8_) {
                      anon_unknown.dwarf_245a2d9::Parser::diagnostic
                                ((DiagnosticStream *)&entry_3,(Parser *)local_3d8);
                      std::operator<<((ostream *)&entry_3,"Invalid word count: Op");
                      pDVar12 = spvtools::DiagnosticStream::operator<<
                                          ((DiagnosticStream *)&entry_3,&opcode_desc->name);
                      std::operator<<((ostream *)pDVar12," starting at word ");
                      std::ostream::_M_insert<unsigned_long>((ulong)pDVar12);
                      std::operator<<((ostream *)pDVar12," says it has ");
                      std::ostream::operator<<(pDVar12,inst_word_count);
                      std::operator<<((ostream *)pDVar12," words, but found ");
                      std::ostream::_M_insert<unsigned_long>((ulong)pDVar12);
                      pcVar26 = " words instead.";
                      goto LAB_0053c332;
                    }
                    __c = (long)local_2a8.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_2a8.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start;
                    if (local_398[0x2c] == true) {
                      __c = (long)__c >> 2;
                      if (__c != uVar14) {
                        __assert_fail("!_.requires_endian_conversion || (inst_word_count == _.endian_converted_words.size())"
                                      ,
                                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/binary.cpp"
                                      ,0x180,
                                      "spv_result_t (anonymous namespace)::Parser::parseInstruction()"
                                     );
                      }
                    }
                    else if (__c != 4) {
                      __assert_fail("_.requires_endian_conversion || (_.endian_converted_words.size() == 1)"
                                    ,
                                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/binary.cpp"
                                    ,0x182,
                                    "spv_result_t (anonymous namespace)::Parser::parseInstruction()"
                                   );
                    }
                    uVar23 = inst.opcode;
                    OVar7 = (Op)inst.opcode;
                    iVar10 = spvOpcodeGeneratesType(OVar7);
                    if (iVar10 == 0) goto LAB_0053c59c;
                    iVar25 = 3;
                    if (OVar7 == OpTypeFloat) {
LAB_0053c3a5:
                      OVar7 = anon_unknown.dwarf_245a2d9::Parser::peekAt
                                        ((Parser *)local_3d8,inst_offset + 2);
                    }
                    else {
                      OVar7 = OpNop;
                      iVar25 = 0;
                      if (uVar23 == 0x15) {
                        uVar11 = anon_unknown.dwarf_245a2d9::Parser::peekAt
                                           ((Parser *)local_3d8,inst_offset + 3);
                        iVar25 = 2 - (uint)(uVar11 == 0);
                        goto LAB_0053c3a5;
                      }
                    }
                    local_448 = CONCAT44(local_448._4_4_,iVar25);
                    uVar14 = (ulong)inst.result_id;
                    uVar22 = uVar14 % (ulong)local_398._112_8_;
                    local_45c = OVar7;
                    p_Var19 = std::
                              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_std::allocator<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                              ::_M_find_node((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_std::allocator<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                              *)(local_398 + 0x68),uVar22,&inst.result_id,__c);
                    if (p_Var19 != (__node_ptr)0x0) goto LAB_0053c587;
                    local_3e0 = uVar14;
                    p_Var19 = (__node_ptr)operator_new(0x18);
                    (p_Var19->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
                    (p_Var19->
                    super__Hash_node_value<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false>
                    ).
                    super__Hash_node_value_base<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>
                    ._M_storage._M_storage.__align =
                         (anon_struct_4_0_00000001_for___align)inst.result_id;
                    *(undefined8 *)
                     ((long)&(p_Var19->
                             super__Hash_node_value<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false>
                             ).
                             super__Hash_node_value_base<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>
                             ._M_storage._M_storage + 4) = 0;
                    auVar31 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                                        ((ulong)(local_398 + 0x88),local_398._112_8_,
                                         local_398._128_8_);
                    __n = auVar31._8_8_;
                    if ((auVar31 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                    goto LAB_0053c51f;
                    if (__n == 1) {
                      local_398._152_8_ = (__node_base_ptr)0x0;
                      __s = (pointer)(local_398 + 0x98);
                    }
                    else {
                      __s = std::allocator_traits<std::allocator<std::__detail::_Hash_node_base_*>_>
                            ::allocate((allocator_type *)&entry_3,__n);
                      memset(__s,0,__n * 8);
                    }
                    p_Var2 = (__node_ptr)local_398._120_8_;
                    local_398._120_8_ = (__node_ptr)0x0;
                    uVar22 = 0;
                    goto LAB_0053c482;
                  }
                  if (local_290.
                      super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                      _M_impl.super__Vector_impl_data._M_start ==
                      local_290.
                      super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
                    sVar3 = (short)local_398._24_8_;
                    anon_unknown.dwarf_245a2d9::Parser::diagnostic
                              ((DiagnosticStream *)&entry_3,(Parser *)local_3d8);
                    std::operator<<((ostream *)&entry_3,"Invalid instruction Op");
                    pDVar12 = spvtools::DiagnosticStream::operator<<
                                        ((DiagnosticStream *)&entry_3,&opcode_desc->name);
                    std::operator<<((ostream *)pDVar12," starting at word ");
                    std::ostream::_M_insert<unsigned_long>((ulong)pDVar12);
                    std::operator<<((ostream *)pDVar12,": expected no more operands after ");
                    std::ostream::operator<<(pDVar12,sVar3 - (short)inst_offset);
                    std::operator<<((ostream *)pDVar12," words, but stated word count is ");
                    std::ostream::operator<<(pDVar12,inst_word_count);
                    pcVar26 = ".";
LAB_0053c332:
                    std::operator<<((ostream *)pDVar12,pcVar26);
                    sVar6 = pDVar12->error_;
                    goto LAB_0053c33d;
                  }
                  type = spvTakeFirstMatchableOperand((spv_operand_pattern_t *)(local_398 + 0x108));
                  uVar23 = (short)local_398._24_8_ - (short)inst_offset;
                  local_458.num_words = 1;
                  local_458.number_kind = SPV_NUMBER_NONE;
                  local_458.number_bit_width = 0;
                  local_458.offset = uVar23;
                  local_458.type = type;
                  if ((ulong)local_398._8_8_ <= (ulong)local_398._24_8_) {
                    sVar6 = anon_unknown.dwarf_245a2d9::Parser::exhaustedInputDiagnostic
                                      ((Parser *)local_3d8,inst_offset,(uint)inst.opcode,type);
                    goto LAB_0053c114;
                  }
                  local_45c = (uint)inst.opcode;
                  OVar7 = anon_unknown.dwarf_245a2d9::Parser::peek((Parser *)local_3d8);
                  word = OVar7;
                  if (0x5b < type - SPV_OPERAND_TYPE_ID) {
switchD_0053b9cd_caseD_16:
                    anon_unknown.dwarf_245a2d9::Parser::diagnostic
                              ((DiagnosticStream *)&entry_3,(Parser *)local_3d8);
                    std::operator<<((ostream *)&entry_3,"Internal error: Unhandled operand type: ");
                    std::ostream::operator<<((DiagnosticStream *)&entry_3,type);
                    goto LAB_0053bac0;
                  }
                  local_448 = (ulong)OVar7;
                  switch(type) {
                  case SPV_OPERAND_TYPE_ID:
                  case SPV_OPERAND_TYPE_FIRST_OPTIONAL_TYPE:
                    if (OVar7 != OpNop) {
                      local_458.type = SPV_OPERAND_TYPE_ID;
                      bVar4 = spvIsExtendedInstruction(local_45c);
                      if (uVar23 == 3 && bVar4) {
                        iVar17 = std::
                                 _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spv_ext_inst_type_t>,_std::allocator<std::pair<const_unsigned_int,_spv_ext_inst_type_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                 ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spv_ext_inst_type_t>,_std::allocator<std::pair<const_unsigned_int,_spv_ext_inst_type_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                         *)(local_398 + 0xa0),&word);
                        if (iVar17.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_spv_ext_inst_type_t>,_false>
                            ._M_cur == (__node_type *)0x0) {
                          anon_unknown.dwarf_245a2d9::Parser::diagnostic
                                    ((DiagnosticStream *)&entry_3,(Parser *)local_3d8,
                                     SPV_ERROR_INVALID_ID);
                          std::operator<<((ostream *)&entry_3,"OpExtInst set Id ");
                          std::ostream::_M_insert<unsigned_long>((ulong)&entry_3);
                          pcVar26 = " does not reference an OpExtInstImport result Id";
                          break;
                        }
                        inst.ext_inst_type =
                             *(spv_ext_inst_type_t *)
                              ((long)iVar17.
                                     super__Node_iterator_base<std::pair<const_unsigned_int,_spv_ext_inst_type_t>,_false>
                                     ._M_cur + 0xc);
                      }
                      goto LAB_0053c049;
                    }
                    anon_unknown.dwarf_245a2d9::Parser::diagnostic
                              ((DiagnosticStream *)&entry_3,(Parser *)local_3d8,SPV_ERROR_INVALID_ID
                              );
                    pcVar26 = "Id is 0";
                    break;
                  case SPV_OPERAND_TYPE_TYPE_ID:
                    if (OVar7 != OpNop) {
                      inst.type_id = OVar7;
                      goto LAB_0053c049;
                    }
                    anon_unknown.dwarf_245a2d9::Parser::diagnostic
                              ((DiagnosticStream *)&entry_3,(Parser *)local_3d8,SPV_ERROR_INVALID_ID
                              );
                    pcVar26 = "Error: Type Id is 0";
                    break;
                  case SPV_OPERAND_TYPE_RESULT_ID:
                    if (OVar7 == OpNop) {
                      anon_unknown.dwarf_245a2d9::Parser::diagnostic
                                ((DiagnosticStream *)&entry_3,(Parser *)local_3d8,
                                 SPV_ERROR_INVALID_ID);
                      pcVar26 = "Error: Result Id is 0";
                    }
                    else {
                      inst.result_id = OVar7;
                      iVar15 = std::
                               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                       *)(local_398 + 0x30),&inst.result_id);
                      if (iVar15.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                          ._M_cur == (__node_type *)0x0) {
                        iVar10 = spvOpcodeGeneratesType(local_45c);
                        mVar1 = (&inst.type_id)[iVar10 != 0];
                        pmVar13 = std::__detail::
                                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                                *)(local_398 + 0x30),&inst.result_id);
                        *pmVar13 = mVar1;
                        goto LAB_0053c049;
                      }
                      anon_unknown.dwarf_245a2d9::Parser::diagnostic
                                ((DiagnosticStream *)&entry_3,(Parser *)local_3d8,
                                 SPV_ERROR_INVALID_ID);
                      std::operator<<((ostream *)&entry_3,"Id ");
                      std::ostream::_M_insert<unsigned_long>((ulong)&entry_3);
                      pcVar26 = " is defined more than once";
                    }
                    break;
                  case SPV_OPERAND_TYPE_MEMORY_SEMANTICS_ID:
                  case SPV_OPERAND_TYPE_SCOPE_ID:
                    if (OVar7 != OpNop) goto LAB_0053c049;
                    anon_unknown.dwarf_245a2d9::Parser::diagnostic
                              ((DiagnosticStream *)&entry_3,(Parser *)local_3d8);
                    pcVar26 = spvOperandTypeStr(type);
                    std::operator<<((ostream *)&entry_3,pcVar26);
                    std::operator<<((ostream *)&entry_3," is 0");
                    goto LAB_0053bac0;
                  case SPV_OPERAND_TYPE_LITERAL_INTEGER:
                  case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_INTEGER:
                    uVar16 = 0x100000006;
                    goto LAB_0053be64;
                  case SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER:
                    bVar4 = spvIsExtendedInstruction(local_45c);
                    if (!bVar4) {
                      __assert_fail("spvIsExtendedInstruction(opcode)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/binary.cpp"
                                    ,0x1f1,
                                    "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                   );
                    }
                    if (inst.ext_inst_type == SPV_EXT_INST_TYPE_NONE) {
                      __assert_fail("inst->ext_inst_type != SPV_EXT_INST_TYPE_NONE",
                                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/binary.cpp"
                                    ,0x1f2,
                                    "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                   );
                    }
                    sVar5 = spvtools::AssemblyGrammar::lookupExtInst
                                      ((AssemblyGrammar *)local_3d8,inst.ext_inst_type,OVar7,
                                       (spv_ext_inst_desc *)&entry);
                    if (sVar5 == SPV_SUCCESS) {
                      types = &entry->numCapabilities;
LAB_0053c044:
                      spvPushOperandTypes(types,(spv_operand_pattern_t *)(local_398 + 0x108));
                    }
                    else {
                      bVar4 = spvExtInstIsNonSemantic(inst.ext_inst_type);
                      if (!bVar4) {
                        anon_unknown.dwarf_245a2d9::Parser::diagnostic
                                  ((DiagnosticStream *)&entry_3,(Parser *)local_3d8);
                        pcVar26 = "Invalid extended instruction number: ";
                        goto LAB_0053baa4;
                      }
                      entry_3._0_4_ = 0x34;
                      std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::
                      emplace_back<spv_operand_type_t>
                                ((spv_operand_pattern_t *)(local_398 + 0x108),
                                 (spv_operand_type_t *)&entry_3);
                    }
                    goto LAB_0053c049;
                  case SPV_OPERAND_TYPE_SPEC_CONSTANT_OP_NUMBER:
                    if (local_45c != OpSpecConstantOp) {
                      __assert_fail("spv::Op::OpSpecConstantOp == opcode",
                                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/binary.cpp"
                                    ,0x207,
                                    "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                   );
                    }
                    if (((int)OVar7 < 0) ||
                       (sVar5 = spvtools::AssemblyGrammar::lookupSpecConstantOpcode
                                          ((AssemblyGrammar *)local_3d8,OVar7), sVar5 != SPV_SUCCESS
                       )) {
                      anon_unknown.dwarf_245a2d9::Parser::diagnostic
                                ((DiagnosticStream *)&entry_3,(Parser *)local_3d8);
                      std::operator<<((ostream *)&entry_3,"Invalid ");
                      pcVar26 = spvOperandTypeStr(SPV_OPERAND_TYPE_SPEC_CONSTANT_OP_NUMBER);
                      std::operator<<((ostream *)&entry_3,pcVar26);
                      pcVar26 = ": ";
                      goto LAB_0053baa4;
                    }
                    entry = (spv_operand_desc)0x0;
                    sVar5 = spvtools::AssemblyGrammar::lookupOpcode
                                      ((AssemblyGrammar *)local_3d8,OVar7,(spv_opcode_desc *)&entry)
                    ;
                    if (sVar5 == SPV_SUCCESS) {
                      if (*(byte *)((long)entry->operandTypes + 0x35) == 0) {
                        __assert_fail("opcode_entry->hasType",
                                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/binary.cpp"
                                      ,0x215,
                                      "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                     );
                      }
                      if ((char)entry->operandTypes[0xd] == SPV_OPERAND_TYPE_NONE) {
                        __assert_fail("opcode_entry->hasResult",
                                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/binary.cpp"
                                      ,0x216,
                                      "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                     );
                      }
                      if ((ushort)entry->numExtensions < 2) {
                        __assert_fail("opcode_entry->numTypes >= 2",
                                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/binary.cpp"
                                      ,0x217,
                                      "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                     );
                      }
                      types = (spv_operand_type_t *)((long)&entry->extensions + 4);
                      goto LAB_0053c044;
                    }
                    anon_unknown.dwarf_245a2d9::Parser::diagnostic
                              ((DiagnosticStream *)&entry_3,(Parser *)local_3d8,SPV_ERROR_INTERNAL);
                    pcVar26 = "OpSpecConstant opcode table out of sync";
                    break;
                  case SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER:
                  case SPV_OPERAND_TYPE_OPTIONAL_TYPED_LITERAL_INTEGER:
                    local_458.type = SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER;
                    if ((local_45c == OpConstant) || (local_45c == OpSpecConstant)) {
                      if (inst.type_id == 0) {
                        __assert_fail("inst->type_id",
                                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/binary.cpp"
                                      ,0x24d,
                                      "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                     );
                      }
                      sVar6 = anon_unknown.dwarf_245a2d9::Parser::setNumericTypeInfoForType
                                        ((Parser *)local_3d8,&local_458,inst.type_id);
                      if (sVar6 != SPV_EXT_INST_TYPE_NONE) goto LAB_0053c114;
                      goto LAB_0053c049;
                    }
                    if (local_45c != OpSwitch) {
                      __assert_fail("opcode == spv::Op::OpConstant || opcode == spv::Op::OpSpecConstant"
                                    ,
                                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/binary.cpp"
                                    ,0x24a,
                                    "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                   );
                    }
                    uVar11 = anon_unknown.dwarf_245a2d9::Parser::peekAt
                                       ((Parser *)local_3d8,local_3e0);
                    entry = (spv_operand_desc)CONCAT44(entry._4_4_,uVar11);
                    iVar15 = std::
                             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                     *)(local_398 + 0x30),(key_type *)&entry);
                    if ((iVar15.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                         ._M_cur == (__node_type *)0x0) ||
                       (uVar11 = *(uint32_t *)
                                  ((long)iVar15.
                                         super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                         ._M_cur + 0xc), uVar11 == 0)) {
                      anon_unknown.dwarf_245a2d9::Parser::diagnostic
                                ((DiagnosticStream *)&entry_3,(Parser *)local_3d8);
                      std::operator<<((ostream *)&entry_3,"Invalid OpSwitch: selector id ");
                      std::ostream::_M_insert<unsigned_long>((ulong)&entry_3);
                      pcVar26 = " has no type";
                    }
                    else if ((uint32_t)entry == uVar11) {
                      anon_unknown.dwarf_245a2d9::Parser::diagnostic
                                ((DiagnosticStream *)&entry_3,(Parser *)local_3d8);
                      std::operator<<((ostream *)&entry_3,"Invalid OpSwitch: selector id ");
                      std::ostream::_M_insert<unsigned_long>((ulong)&entry_3);
                      pcVar26 = " is a type, not a value";
                    }
                    else {
                      sVar6 = anon_unknown.dwarf_245a2d9::Parser::setNumericTypeInfoForType
                                        ((Parser *)local_3d8,&local_458,uVar11);
                      if (sVar6 != SPV_EXT_INST_TYPE_NONE) goto LAB_0053c114;
                      if (0xfffffffd < local_458.number_kind - SPV_NUMBER_FLOATING)
                      goto LAB_0053c049;
                      anon_unknown.dwarf_245a2d9::Parser::diagnostic
                                ((DiagnosticStream *)&entry_3,(Parser *)local_3d8);
                      std::operator<<((ostream *)&entry_3,"Invalid OpSwitch: selector id ");
                      std::ostream::_M_insert<unsigned_long>((ulong)&entry_3);
                      pcVar26 = " is not a scalar integer";
                    }
                    break;
                  case SPV_OPERAND_TYPE_LITERAL_FLOAT:
                    uVar16 = 0x30000000a;
LAB_0053be64:
                    local_458.type = (spv_operand_type_t)uVar16;
                    local_458.number_kind = (spv_number_kind_t)((ulong)uVar16 >> 0x20);
                    local_458.number_bit_width = 0x20;
                    goto LAB_0053c049;
                  case SPV_OPERAND_TYPE_LITERAL_STRING:
                  case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_STRING:
                    lVar28 = local_398._8_8_ - local_398._24_8_;
                    spvtools::utils::MakeString<unsigned_int_const*>
                              ((string *)&entry,(utils *)(local_398._0_8_ + local_398._24_8_ * 4),
                               (uint *)(local_398._0_8_ + local_398._8_8_ * 4),(uint *)0x0,
                               SUB81(p_Var27,0));
                    if (local_430 == lVar28 * 4) {
                      sVar6 = anon_unknown.dwarf_245a2d9::Parser::exhaustedInputDiagnostic
                                        ((Parser *)local_3d8,inst_offset,local_45c,type);
LAB_0053b6d6:
                      bVar4 = false;
                    }
                    else {
                      lVar28 = (local_430 >> 2) + 1;
                      sVar6 = (spv_ext_inst_type_t)lVar28;
                      if (0x3fffb < local_430) {
                        anon_unknown.dwarf_245a2d9::Parser::diagnostic
                                  ((DiagnosticStream *)&entry_3,(Parser *)local_3d8);
                        std::operator<<((ostream *)&entry_3,"Literal string is longer than ");
                        std::ostream::_M_insert<unsigned_long>((ulong)&entry_3);
                        std::operator<<((ostream *)&entry_3," words: ");
                        std::ostream::_M_insert<unsigned_long>((ulong)&entry_3);
                        pcVar26 = " words long";
LAB_0053b6c2:
                        std::operator<<((ostream *)&entry_3,pcVar26);
                        sVar6 = local_78;
                        spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&entry_3);
                        goto LAB_0053b6d6;
                      }
                      local_458.num_words = (uint16_t)lVar28;
                      local_458.type = SPV_OPERAND_TYPE_LITERAL_STRING;
                      bVar4 = true;
                      if (local_45c == OpExtInstImport) {
                        sVar6 = spvExtInstImportTypeGet((char *)entry);
                        if (sVar6 == SPV_EXT_INST_TYPE_NONE) {
                          anon_unknown.dwarf_245a2d9::Parser::diagnostic
                                    ((DiagnosticStream *)&entry_3,(Parser *)local_3d8);
                          std::operator<<((ostream *)&entry_3,
                                          "Invalid extended instruction import \'");
                          std::operator<<((ostream *)&entry_3,(string *)&entry);
                          pcVar26 = "\'";
                          goto LAB_0053b6c2;
                        }
                        if (inst.result_id == 0) {
                          __assert_fail("inst->result_id",
                                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/binary.cpp"
                                        ,0x276,
                                        "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                       );
                        }
                        pmVar18 = std::__detail::
                                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spv_ext_inst_type_t>,_std::allocator<std::pair<const_unsigned_int,_spv_ext_inst_type_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spv_ext_inst_type_t>,_std::allocator<std::pair<const_unsigned_int,_spv_ext_inst_type_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                                *)(local_398 + 0xa0),&inst.result_id);
                        *pmVar18 = sVar6;
                      }
                    }
                    std::__cxx11::string::_M_dispose();
                    if (!bVar4) goto LAB_0053c114;
                    goto LAB_0053c049;
                  case SPV_OPERAND_TYPE_SOURCE_LANGUAGE:
                    sVar5 = spvtools::AssemblyGrammar::lookupOperand
                                      ((AssemblyGrammar *)local_3d8,SPV_OPERAND_TYPE_SOURCE_LANGUAGE
                                       ,OVar7,&entry);
                    if (sVar5 == SPV_SUCCESS) {
LAB_0053c038:
                      types = entry->operandTypes;
                      goto LAB_0053c044;
                    }
                    anon_unknown.dwarf_245a2d9::Parser::diagnostic
                              ((DiagnosticStream *)&entry_3,(Parser *)local_3d8);
                    std::operator<<((ostream *)&entry_3,"Invalid ");
                    pcVar26 = spvOperandTypeStr(SPV_OPERAND_TYPE_SOURCE_LANGUAGE);
                    std::operator<<((ostream *)&entry_3,pcVar26);
                    std::operator<<((ostream *)&entry_3," operand: ");
                    std::ostream::_M_insert<unsigned_long>((ulong)&entry_3);
                    pcVar26 = 
                    ", if you are creating a new source language please use value 0 (Unknown) and when ready, add your source language to SPIRV-Headers"
                    ;
                    break;
                  default:
                    sVar8 = SPV_OPERAND_TYPE_ACCESS_QUALIFIER;
                    if (type == SPV_OPERAND_TYPE_OPTIONAL_ACCESS_QUALIFIER) {
LAB_0053ba46:
                      sVar9 = sVar8;
                      local_458.type = sVar8;
                    }
                    else {
                      if (type == SPV_OPERAND_TYPE_OPTIONAL_PACKED_VECTOR_FORMAT) {
                        sVar8 = SPV_OPERAND_TYPE_PACKED_VECTOR_FORMAT;
                        goto LAB_0053ba46;
                      }
                      sVar8 = SPV_OPERAND_TYPE_FPENCODING;
                      sVar9 = type;
                      if (type == SPV_OPERAND_TYPE_OPTIONAL_FPENCODING) goto LAB_0053ba46;
                    }
                    sVar5 = spvtools::AssemblyGrammar::lookupOperand
                                      ((AssemblyGrammar *)local_3d8,type,OVar7,&entry);
                    if (sVar5 == SPV_SUCCESS) goto LAB_0053c038;
                    anon_unknown.dwarf_245a2d9::Parser::diagnostic
                              ((DiagnosticStream *)&entry_3,(Parser *)local_3d8);
                    std::operator<<((ostream *)&entry_3,"Invalid ");
                    pcVar26 = spvOperandTypeStr(sVar9);
                    std::operator<<((ostream *)&entry_3,pcVar26);
                    pcVar26 = " operand: ";
LAB_0053baa4:
                    std::operator<<((ostream *)&entry_3,pcVar26);
                    std::ostream::_M_insert<unsigned_long>((ulong)&entry_3);
                    goto LAB_0053bac0;
                  case SPV_OPERAND_TYPE_IMAGE_CHANNEL_ORDER:
                  case SPV_OPERAND_TYPE_IMAGE_CHANNEL_DATA_TYPE:
                  case SPV_OPERAND_TYPE_FRAGMENT_SHADING_RATE:
                  case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_NUMBER:
                  case SPV_OPERAND_TYPE_OPTIONAL_CIV:
                  case SPV_OPERAND_TYPE_FIRST_VARIABLE_TYPE:
                  case SPV_OPERAND_TYPE_VARIABLE_LITERAL_INTEGER:
                  case SPV_OPERAND_TYPE_VARIABLE_LITERAL_INTEGER_ID:
                  case SPV_OPERAND_TYPE_LAST_OPTIONAL_TYPE:
                  case SPV_OPERAND_TYPE_COOPERATIVE_MATRIX_LAYOUT:
                  case SPV_OPERAND_TYPE_COOPERATIVE_MATRIX_USE:
                  case SPV_OPERAND_TYPE_INITIALIZATION_MODE_QUALIFIER:
                  case SPV_OPERAND_TYPE_RAW_ACCESS_CHAIN_OPERANDS:
                  case SPV_OPERAND_TYPE_TENSOR_CLAMP_MODE:
                    goto switchD_0053b9cd_caseD_16;
                  case SPV_OPERAND_TYPE_IMAGE:
                  case SPV_OPERAND_TYPE_FP_FAST_MATH_MODE:
                  case SPV_OPERAND_TYPE_SELECTION_CONTROL:
                  case SPV_OPERAND_TYPE_LOOP_CONTROL:
                  case SPV_OPERAND_TYPE_FUNCTION_CONTROL:
                  case SPV_OPERAND_TYPE_MEMORY_ACCESS:
                  case SPV_OPERAND_TYPE_OPTIONAL_IMAGE:
                  case SPV_OPERAND_TYPE_OPTIONAL_MEMORY_ACCESS:
                  case SPV_OPERAND_TYPE_DEBUG_INFO_FLAGS:
                  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_INFO_FLAGS:
                  case SPV_OPERAND_TYPE_COOPERATIVE_MATRIX_OPERANDS:
                  case SPV_OPERAND_TYPE_OPTIONAL_COOPERATIVE_MATRIX_OPERANDS:
                  case SPV_OPERAND_TYPE_OPTIONAL_RAW_ACCESS_CHAIN_OPERANDS:
                  case SPV_OPERAND_TYPE_COOPERATIVE_MATRIX_REDUCE:
                  case SPV_OPERAND_TYPE_TENSOR_ADDRESSING_OPERANDS:
                  case SPV_OPERAND_TYPE_MATRIX_MULTIPLY_ACCUMULATE_OPERANDS:
                  case SPV_OPERAND_TYPE_OPTIONAL_MATRIX_MULTIPLY_ACCUMULATE_OPERANDS:
                    sVar8 = SPV_OPERAND_TYPE_IMAGE;
                    sVar9 = sVar8;
                    if (type != SPV_OPERAND_TYPE_OPTIONAL_IMAGE) {
                      if (type == SPV_OPERAND_TYPE_OPTIONAL_MATRIX_MULTIPLY_ACCUMULATE_OPERANDS) {
                        sVar8 = SPV_OPERAND_TYPE_MATRIX_MULTIPLY_ACCUMULATE_OPERANDS;
                        sVar9 = sVar8;
                      }
                      else if (type == SPV_OPERAND_TYPE_OPTIONAL_COOPERATIVE_MATRIX_OPERANDS) {
                        sVar8 = SPV_OPERAND_TYPE_COOPERATIVE_MATRIX_OPERANDS;
                        sVar9 = sVar8;
                      }
                      else if (type == SPV_OPERAND_TYPE_OPTIONAL_RAW_ACCESS_CHAIN_OPERANDS) {
                        sVar8 = SPV_OPERAND_TYPE_RAW_ACCESS_CHAIN_OPERANDS;
                        sVar9 = sVar8;
                      }
                      else {
                        sVar8 = type;
                        sVar9 = local_458.type;
                        if (type == SPV_OPERAND_TYPE_OPTIONAL_MEMORY_ACCESS) {
                          sVar8 = SPV_OPERAND_TYPE_MEMORY_ACCESS;
                          sVar9 = sVar8;
                        }
                      }
                    }
                    local_458.type = sVar9;
                    operand = ~Max;
                    OVar29 = OVar7;
                    while (OVar29 != OpNop) {
                      if ((OVar29 & operand) != OpNop) {
                        sVar5 = spvtools::AssemblyGrammar::lookupOperand
                                          ((AssemblyGrammar *)local_3d8,type,operand,&entry);
                        if (sVar5 != SPV_SUCCESS) {
                          anon_unknown.dwarf_245a2d9::Parser::diagnostic
                                    ((DiagnosticStream *)&entry_3,(Parser *)local_3d8);
                          std::operator<<((ostream *)&entry_3,"Invalid ");
                          pcVar26 = spvOperandTypeStr(sVar8);
                          std::operator<<((ostream *)&entry_3,pcVar26);
                          std::operator<<((ostream *)&entry_3," operand: ");
                          std::ostream::_M_insert<unsigned_long>((ulong)&entry_3);
                          std::operator<<((ostream *)&entry_3," has invalid mask component ");
                          std::ostream::_M_insert<unsigned_long>((ulong)&entry_3);
                          sVar6 = local_78;
                          spvtools::DiagnosticStream::~DiagnosticStream
                                    ((DiagnosticStream *)&entry_3);
                          goto LAB_0053c114;
                        }
                        OVar29 = OVar29 ^ operand;
                        spvPushOperandTypes(entry->operandTypes,
                                            (spv_operand_pattern_t *)(local_398 + 0x108));
                      }
                      operand = operand >> 1;
                    }
                    if ((OVar7 == OpNop) &&
                       (sVar5 = spvtools::AssemblyGrammar::lookupOperand
                                          ((AssemblyGrammar *)local_3d8,type,0,&entry_3),
                       sVar5 == SPV_SUCCESS)) {
                      types = (spv_operand_type_t *)
                              (CONCAT44(entry_3._4_4_,(uint32_t)entry_3) + 0x38);
                      goto LAB_0053c044;
                    }
LAB_0053c049:
                    bVar4 = spvOperandIsConcrete(local_458.type);
                    if (!bVar4) {
                      __assert_fail("spvOperandIsConcrete(parsed_operand.type)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/binary.cpp"
                                    ,0x30c,
                                    "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                   );
                    }
                    std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::
                    push_back((vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *
                              )(local_398 + 0xd8),&local_458);
                    endian = local_398._40_4_;
                    uVar16 = local_398._0_8_;
                    uVar22 = local_398._24_8_ + (ulong)local_458.num_words;
                    if ((ulong)local_398._8_8_ < uVar22) {
                      sVar6 = anon_unknown.dwarf_245a2d9::Parser::exhaustedInputDiagnostic
                                        ((Parser *)local_3d8,inst_offset,local_45c,type);
                    }
                    else {
                      if (local_398[0x2c] == true) {
                        lVar30 = local_398._24_8_ * 4;
                        uVar14 = (ulong)local_458.num_words;
                        for (lVar28 = 0; uVar14 * 4 != lVar28; lVar28 = lVar28 + 4) {
                          entry_3._0_4_ = spvFixWord(*(uint32_t *)(uVar16 + lVar28 + lVar30),endian)
                          ;
                          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                          emplace_back<unsigned_int>
                                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                     (local_398 + 0xf0),(uint *)&entry_3);
                        }
                      }
                      sVar6 = SPV_EXT_INST_TYPE_NONE;
                      local_398._24_8_ = uVar22;
                    }
                    goto LAB_0053c114;
                  }
                  std::operator<<((ostream *)&entry_3,pcVar26);
LAB_0053bac0:
                  sVar6 = local_78;
                  spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&entry_3);
LAB_0053c114:
                } while (sVar6 == SPV_EXT_INST_TYPE_NONE);
              }
              else {
                anon_unknown.dwarf_245a2d9::Parser::diagnostic
                          ((DiagnosticStream *)&entry_3,(Parser *)local_3d8);
                std::operator<<((ostream *)&entry_3,"Invalid opcode: ");
                std::ostream::operator<<((DiagnosticStream *)&entry_3,inst.opcode);
                sVar6 = local_78;
LAB_0053c33d:
                spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&entry_3);
              }
            }
            goto LAB_0053c34d;
          }
          sVar6 = SPV_EXT_INST_TYPE_NONE;
          if (local_398._24_8_ != local_398._8_8_) {
            __assert_fail("_.word_index == _.num_words",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/binary.cpp"
                          ,0x120,"spv_result_t (anonymous namespace)::Parser::parseModule()");
          }
          goto LAB_0053b358;
        }
        p_Var27 = (spv_parsed_header_fn_t)(ulong)header.generator;
        sVar6 = (*local_3a8)(local_3b0,local_398._40_4_,header.magic,header.version,header.generator
                             ,header.bound,header.schema);
        if (sVar6 == SPV_EXT_INST_TYPE_NONE) goto LAB_0053b462;
        goto LAB_0053b358;
      }
      anon_unknown.dwarf_245a2d9::Parser::diagnostic
                ((DiagnosticStream *)&entry_3,(Parser *)local_3d8,SPV_ERROR_INTERNAL);
      pcVar26 = "Internal error: unhandled header parse failure";
      goto LAB_0053b2ac;
    }
    anon_unknown.dwarf_245a2d9::Parser::diagnostic((DiagnosticStream *)&entry_3,(Parser *)local_3d8)
    ;
    std::operator<<((ostream *)&entry_3,"Invalid SPIR-V magic number \'");
    lVar28 = *(long *)(CONCAT44(entry_3._4_4_,(uint32_t)entry_3) + -0x18);
    *(uint *)((long)auStack_230 + lVar28) = *(uint *)((long)auStack_230 + lVar28) & 0xffffffb5 | 8;
    pDVar12 = spvtools::DiagnosticStream::operator<<
                        ((DiagnosticStream *)&entry_3,(uint *)local_398._0_8_);
    std::operator<<((ostream *)pDVar12,"\'.");
    sVar6 = pDVar12->error_;
  }
  spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&entry_3);
LAB_0053b358:
  anon_unknown.dwarf_245a2d9::Parser::State::State((State *)&entry_3);
  anon_unknown.dwarf_245a2d9::Parser::State::operator=((State *)local_398,(State *)&entry_3);
  anon_unknown.dwarf_245a2d9::Parser::State::~State((State *)&entry_3);
  anon_unknown.dwarf_245a2d9::Parser::State::~State((State *)local_398);
  if (hijack_context.consumer.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*hijack_context.consumer.super__Function_base._M_manager)
              ((_Any_data *)&hijack_context.consumer,(_Any_data *)&hijack_context.consumer,
               __destroy_functor);
  }
  return sVar6;
LAB_0053c482:
  uVar14 = uVar22;
  p_Var21 = p_Var2;
  if (p_Var21 != (__node_ptr)0x0) {
    p_Var2 = (__node_ptr)(p_Var21->super__Hash_node_base)._M_nxt;
    uVar22 = (ulong)(uint)(p_Var21->
                          super__Hash_node_value<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false>
                          ).
                          super__Hash_node_value_base<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>
                          ._M_storage._M_storage.__align % __n;
    if (__s[uVar22] == (_Hash_node_base *)0x0) goto LAB_0053c4b2;
    (p_Var21->super__Hash_node_base)._M_nxt = __s[uVar22]->_M_nxt;
    p_Var20 = __s[uVar22];
    uVar22 = uVar14;
    goto LAB_0053c4e3;
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_std::allocator<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_deallocate_buckets
            ((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_std::allocator<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)(local_398 + 0x68));
  uVar22 = local_3e0 % __n;
  local_398._104_8_ = __s;
  local_398._112_8_ = __n;
LAB_0053c51f:
  if (*(pointer)(local_398._104_8_ + uVar22 * 8) == (_Hash_node_base *)0x0) {
    (p_Var19->super__Hash_node_base)._M_nxt = (_Hash_node_base *)local_398._120_8_;
    if ((__node_ptr)local_398._120_8_ != (__node_ptr)0x0) {
      *(__node_ptr *)
       (local_398._104_8_ +
       ((ulong)(uint)(((_Hash_node_value<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false>
                        *)(local_398._120_8_ + 8))->
                     super__Hash_node_value_base<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>
                     )._M_storage._M_storage.__align % (ulong)local_398._112_8_) * 8) = p_Var19;
    }
    *(undefined1 **)(local_398._104_8_ + uVar22 * 8) = local_398 + 0x78;
    local_398._120_8_ = p_Var19;
  }
  else {
    (p_Var19->super__Hash_node_base)._M_nxt = (*(pointer)(local_398._104_8_ + uVar22 * 8))->_M_nxt;
    (*(pointer)(local_398._104_8_ + uVar22 * 8))->_M_nxt = (_Hash_node_base *)p_Var19;
  }
  local_398._128_8_ = local_398._128_8_ + 1;
LAB_0053c587:
  *(undefined4 *)
   ((long)&(p_Var19->
           super__Hash_node_value<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false>
           ).
           super__Hash_node_value_base<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>
           ._M_storage._M_storage + 4) = (undefined4)local_448;
  *(Op *)((long)&(p_Var19->
                 super__Hash_node_value<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false>
                 ).
                 super__Hash_node_value_base<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>
                 ._M_storage._M_storage + 8) = local_45c;
LAB_0053c59c:
  inst.words = local_2a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
  if (local_398[0x2c] == false) {
    inst.words = (uint32_t *)(local_398._0_8_ + inst_offset * 4);
  }
  inst.num_words = inst_word_count;
  inst.operands =
       local_2c0.super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
       _M_impl.super__Vector_impl_data._M_start;
  inst.num_operands =
       (uint16_t)
       ((uint)((int)local_2c0.
                    super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (int)local_2c0.
                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                   _M_impl.super__Vector_impl_data._M_start) >> 4);
  if ((local_3a0 == (spv_parsed_instruction_fn_t)0x0) ||
     (sVar6 = (*local_3a0)(local_3b0,&inst), sVar6 == SPV_EXT_INST_TYPE_NONE)) {
    sVar6 = SPV_EXT_INST_TYPE_NONE;
  }
LAB_0053c34d:
  if (sVar6 != SPV_EXT_INST_TYPE_NONE) goto LAB_0053b358;
  goto LAB_0053b485;
LAB_0053c4b2:
  (p_Var21->super__Hash_node_base)._M_nxt = (_Hash_node_base *)local_398._120_8_;
  __s[uVar22] = (_Hash_node_base *)(local_398 + 0x78);
  local_398._120_8_ = p_Var21;
  if ((p_Var21->super__Hash_node_base)._M_nxt != (_Hash_node_base *)0x0) {
    p_Var20 = (_Hash_node_base *)(__s + uVar14);
LAB_0053c4e3:
    p_Var20->_M_nxt = &p_Var21->super__Hash_node_base;
  }
  goto LAB_0053c482;
}

Assistant:

spv_result_t spvBinaryParse(const spv_const_context context, void* user_data,
                            const uint32_t* code, const size_t num_words,
                            spv_parsed_header_fn_t parsed_header,
                            spv_parsed_instruction_fn_t parsed_instruction,
                            spv_diagnostic* diagnostic) {
  spv_context_t hijack_context = *context;
  if (diagnostic) {
    *diagnostic = nullptr;
    spvtools::UseDiagnosticAsMessageConsumer(&hijack_context, diagnostic);
  }
  Parser parser(&hijack_context, user_data, parsed_header, parsed_instruction);
  return parser.parse(code, num_words, diagnostic);
}